

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

Array2D<float> * __thiscall
pbrt::Image::
GetSamplingDistribution<pbrt::ProjectionLight::ProjectionLight(pbrt::Transform,pbrt::MediumInterface,pbrt::Image,pbrt::RGBColorSpace_const*,float,float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>
          (Image *this,anon_class_8_1_8991fb9c dxdA,Bounds2f *domain,Allocator alloc)

{
  int *piVar1;
  Array2D<float> *in_RSI;
  Array2D<float> *in_RDI;
  function<void_(long,_long)> *in_stack_00000020;
  int64_t in_stack_00000028;
  int64_t in_stack_00000030;
  Array2D<float> *dist;
  undefined4 in_stack_ffffffffffffff48;
  int iVar2;
  function<void_(long,_long)> *this_00;
  Array2D<float> *pAVar3;
  allocator_type in_stack_ffffffffffffff70;
  
  this_00 = (function<void_(long,_long)> *)&(in_RSI->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  pAVar3 = in_RDI;
  piVar1 = Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)this_00,0);
  iVar2 = *piVar1;
  Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)this_00,1);
  Array2D<float>::Array2D(in_RSI,(int)((ulong)pAVar3 >> 0x20),(int)pAVar3,in_stack_ffffffffffffff70)
  ;
  Tuple2<pbrt::Point2,_int>::operator[]((Tuple2<pbrt::Point2,_int> *)this_00,1);
  std::function<void(long,long)>::
  function<pbrt::Image::GetSamplingDistribution<pbrt::ProjectionLight::ProjectionLight(pbrt::Transform,pbrt::MediumInterface,pbrt::Image,pbrt::RGBColorSpace_const*,float,float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>(pbrt::ProjectionLight::ProjectionLight(pbrt::Transform,pbrt::MediumInterface,pbrt::Image,pbrt::RGBColorSpace_const*,float,float,pstd::pmr::polymorphic_allocator<std::byte>)::__0,pbrt::Bounds2<float>const&,pstd::pmr::polymorphic_allocator<std::byte>)::_lambda(long,long)_1_,void>
            (this_00,(anon_class_32_4_dc7e2502 *)CONCAT44(iVar2,in_stack_ffffffffffffff48));
  ParallelFor(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x6907c9);
  return in_RDI;
}

Assistant:

inline Array2D<Float> Image::GetSamplingDistribution(F dxdA, const Bounds2f &domain,
                                                     Allocator alloc) {
    Array2D<Float> dist(resolution[0], resolution[1], alloc);
    ParallelFor(0, resolution[1], [&](int64_t y0, int64_t y1) {
        for (int y = y0; y < y1; ++y) {
            for (int x = 0; x < resolution[0]; ++x) {
                // This is noticeably better than MaxValue: discuss / show
                // example..
                Float value = GetChannels({x, y}).Average();

                // Assume Jacobian term is basically constant over the
                // region.
                Point2f p = domain.Lerp(
                    Point2f((x + .5f) / resolution[0], (y + .5f) / resolution[1]));
                dist(x, y) = value * dxdA(p);
            }
        }
    });
    return dist;
}